

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::JITPageAddrToFuncRangeCache::AddFuncRange
          (JITPageAddrToFuncRangeCache *this,void *address,uint bytes)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *pHVar3;
  BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar4;
  BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  uint uVar5;
  undefined1 local_70 [8];
  uint byteCount;
  size_t local_60;
  char *local_58;
  DWORD local_50;
  void *local_48;
  void *pageAddr;
  AutoCriticalSection autocs;
  RangeMap *rangeMap;
  void *pvStack_28;
  uint bytes_local;
  void *address_local;
  
  uVar5 = (uint)address;
  pageAddr = cs;
  rangeMap._4_4_ = bytes;
  pvStack_28 = address;
  CCLock::Enter((CCLock *)cs);
  if (bytes < 0x1001) {
    this_00 = this->jitPageAddrToFuncRangeMap;
    if (this_00 ==
        (BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      local_70 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      _byteCount = 0;
      local_60 = 0xffffffffffffffff;
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_50 = 0x1ac9;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      this_00 = (BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::HeapAllocator>(0x38,pHVar3,0x2f6726);
      JsUtil::
      BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_00,&Memory::HeapAllocator::Instance,0x403);
      this->jitPageAddrToFuncRangeMap = this_00;
      uVar5 = (uint)pvStack_28;
    }
    local_48 = (void *)(ulong)(uVar5 & 0xfffff000);
    autocs.cs = (CriticalSection *)0x0;
    bVar2 = JsUtil::
            BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_00,&local_48,
                       (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        **)&autocs);
    if (autocs.cs == (CriticalSection *)0x0) {
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x1ad1,"(!isPageAddrFound)","!isPageAddrFound");
        if (!bVar2) goto LAB_006f40d6;
        *puVar4 = 0;
      }
      local_70 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      _byteCount = 0;
      local_60 = 0xffffffffffffffff;
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_50 = 0x1ad2;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      autocs.cs = (CriticalSection *)new<Memory::HeapAllocator>(0x38,pHVar3,0x2f6726);
      ((autocs.cs)->super_CCLock).mutexPtr[0] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[1] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[2] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[3] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[4] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[5] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[6] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[7] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[8] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[9] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[10] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0xb] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0xc] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0xd] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0xe] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0xf] = '\0';
      *(HeapAllocator **)(((autocs.cs)->super_CCLock).mutexPtr + 0x10) =
           &Memory::HeapAllocator::Instance;
      ((autocs.cs)->super_CCLock).mutexPtr[0x18] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x19] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x1a] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x1b] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x1c] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x1d] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x1e] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x1f] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x20] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x21] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x22] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x23] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x28] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x29] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x2a] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x2b] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x2c] = 'K';
      ((autocs.cs)->super_CCLock).mutexPtr[0x2d] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x2e] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x2f] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x30] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x31] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x32] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x33] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x34] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x35] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x36] = '\0';
      ((autocs.cs)->super_CCLock).mutexPtr[0x37] = '\0';
      JsUtil::
      BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->jitPageAddrToFuncRangeMap,&local_48,
                 (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  **)&autocs);
    }
    local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffff00000000);
    bVar2 = JsUtil::
            BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)autocs.cs,&stack0xffffffffffffffd8,(uint *)local_70);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1ad6,"(!rangeMap->TryGetValue(address, &byteCount))",
                                  "!rangeMap->TryGetValue(address, &byteCount)");
      if (!bVar2) {
LAB_006f40d6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    JsUtil::
    BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)autocs.cs,&stack0xffffffffffffffd8,(uint *)((long)&rangeMap + 4));
  }
  else {
    this_01 = this->largeJitFuncToSizeMap;
    if (this_01 ==
        (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      local_70 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      _byteCount = 0;
      local_60 = 0xffffffffffffffff;
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_50 = 0x1add;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      this_01 = (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::HeapAllocator>(0x38,pHVar3,0x2f6726);
      JsUtil::
      BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,&Memory::HeapAllocator::Instance,0x403);
      this->largeJitFuncToSizeMap = this_01;
    }
    local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffff00000000);
    bVar2 = JsUtil::
            BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_01,&stack0xffffffffffffffd8,(uint *)local_70);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1ae1,
                                  "(!largeJitFuncToSizeMap->TryGetValue(address, &byteCount))",
                                  "!largeJitFuncToSizeMap->TryGetValue(address, &byteCount)");
      if (!bVar2) goto LAB_006f40d6;
      *puVar4 = 0;
    }
    JsUtil::
    BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->largeJitFuncToSizeMap,&stack0xffffffffffffffd8,(uint *)((long)&rangeMap + 4)
              );
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&pageAddr);
  return;
}

Assistant:

void JITPageAddrToFuncRangeCache::AddFuncRange(void * address, uint bytes)
    {
        AutoCriticalSection autocs(GetCriticalSection());

        if (bytes <= AutoSystemInfo::PageSize)
        {
            if (jitPageAddrToFuncRangeMap == nullptr)
            {
                jitPageAddrToFuncRangeMap = HeapNew(JITPageAddrToFuncRangeMap, &HeapAllocator::Instance, 1027);
            }

            void * pageAddr = GetPageAddr(address);
            RangeMap * rangeMap = nullptr;
            bool isPageAddrFound = jitPageAddrToFuncRangeMap->TryGetValue(pageAddr, &rangeMap);
            if (rangeMap == nullptr)
            {
                Assert(!isPageAddrFound);
                rangeMap = HeapNew(RangeMap, &HeapAllocator::Instance);
                jitPageAddrToFuncRangeMap->Add(pageAddr, rangeMap);
            }
            uint byteCount = 0;
            Assert(!rangeMap->TryGetValue(address, &byteCount));
            rangeMap->Add(address, bytes);
        }
        else
        {
            if (largeJitFuncToSizeMap == nullptr)
            {
                largeJitFuncToSizeMap = HeapNew(LargeJITFuncAddrToSizeMap, &HeapAllocator::Instance, 1027);
            }

            uint byteCount = 0;
            Assert(!largeJitFuncToSizeMap->TryGetValue(address, &byteCount));
            largeJitFuncToSizeMap->Add(address, bytes);
        }
    }